

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

void __thiscall Function::Function(Function *this,Function *right,Matrix *m,FunctionType type)

{
  double dVar1;
  Matrix *pMVar2;
  Function *ctx;
  
  ctx = right;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_00155070;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sName)._M_dataplus._M_p = (pointer)&(this->sName).field_2;
  (this->sName)._M_string_length = 0;
  (this->sName).field_2._M_local_buf[0] = '\0';
  init(this,(EVP_PKEY_CTX *)ctx);
  this->xRight = right;
  dVar1 = right->dXMax;
  this->dXMin = right->dXMin;
  this->dXMax = dVar1;
  dVar1 = right->dYMin;
  this->dXStep = right->dXStep;
  this->dYMin = dVar1;
  dVar1 = right->dYStep;
  this->dYMax = right->dYMax;
  this->dYStep = dVar1;
  pMVar2 = (Matrix *)0x0;
  if (type == X_TABLE) {
    pMVar2 = m;
  }
  this->xTable = pMVar2;
  setType(this,type);
  return;
}

Assistant:

Function::Function( Function &right, Matrix *m, FunctionType type )
{
	init();
	xRight = &right;
	dXMin = right.dXMin;
	dXMax = right.dXMax;
	dXStep = right.dXStep;
	dYMin = right.dYMin;
	dYMax = right.dYMax;
	dYStep = right.dYStep;
	switch (type) {
		case X_TABLE:
			xTable = m;
			break;
		default:
			xTable = 0;
	}
	setType(type);
}